

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrLDY0xa0(CPU *this)

{
  uint8_t argument;
  
  argument = immediate_addr(this);
  LDY(this,argument);
  return 2;
}

Assistant:

int CPU::instrLDY0xa0() {
	LDY(immediate_addr());
	return 2;
}